

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall tcu::TextureCube::TextureCube(TextureCube *this,TextureFormat *format,int size)

{
  int numLevels_00;
  reference pvVar1;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *local_d8;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *local_b0;
  TextureCubeView local_a8;
  int local_6c;
  int face;
  ConstPixelBufferAccess *levels [6];
  int numLevels;
  int size_local;
  TextureFormat *format_local;
  TextureCube *this_local;
  
  this->m_format = *format;
  this->m_size = size;
  local_b0 = this->m_data;
  do {
    std::
    vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ::vector(local_b0);
    local_b0 = local_b0 + 1;
  } while (local_b0 !=
           (vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
            *)this->m_access);
  local_d8 = this->m_access;
  do {
    std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::vector(local_d8);
    local_d8 = local_d8 + 1;
  } while ((TextureCubeView *)local_d8 != &this->m_view);
  TextureCubeView::TextureCubeView(&this->m_view);
  numLevels_00 = computeMipPyramidLevels(this->m_size);
  for (local_6c = 0; local_6c < 6; local_6c = local_6c + 1) {
    std::
    vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ::resize(this->m_data + local_6c,(long)numLevels_00);
    std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::resize
              (this->m_access + local_6c,(long)numLevels_00);
    pvVar1 = std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::
             operator[](this->m_access + local_6c,0);
    *(reference *)(&stack0xffffffffffffff98 + (long)local_6c * 8) = pvVar1;
  }
  TextureCubeView::TextureCubeView
            (&local_a8,numLevels_00,(ConstPixelBufferAccess *(*) [6])&stack0xffffffffffffff98);
  memcpy(&this->m_view,&local_a8,0x38);
  return;
}

Assistant:

TextureCube::TextureCube (const TextureFormat& format, int size)
	: m_format	(format)
	, m_size	(size)
{
	const int						numLevels		= computeMipPyramidLevels(m_size);
	const ConstPixelBufferAccess*	levels[CUBEFACE_LAST];

	for (int face = 0; face < CUBEFACE_LAST; face++)
	{
		m_data[face].resize(numLevels);
		m_access[face].resize(numLevels);
		levels[face] = &m_access[face][0];
	}

	m_view = TextureCubeView(numLevels, levels);
}